

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O2

void __thiscall
QFutureInterfaceBase::setProgressValueAndText
          (QFutureInterfaceBase *this,int progressValue,QString *progressText)

{
  bool bVar1;
  ProgressData *pPVar2;
  QFutureInterfaceBasePrivate *pQVar3;
  long in_FS_OFFSET;
  QFutureCallOutEvent local_70;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QMutexLocker<QMutex>::QMutexLocker((QMutexLocker<QMutex> *)local_38,&this->d->m_mutex);
  pQVar3 = this->d;
  pPVar2 = (pQVar3->m_progress).d;
  if (pPVar2 == (ProgressData *)0x0) {
    pPVar2 = (ProgressData *)operator_new(0x20);
    (pPVar2->text).d.ptr = (char16_t *)0x0;
    (pPVar2->text).d.size = 0;
    pPVar2->minimum = 0;
    pPVar2->maximum = 0;
    (pPVar2->text).d.d = (Data *)0x0;
    QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
    ::reset(&pQVar3->m_progress,pPVar2);
    pQVar3 = this->d;
    pPVar2 = (pQVar3->m_progress).d;
  }
  if ((((pPVar2->maximum == 0 && pPVar2->minimum == 0) ||
       (progressValue <= pPVar2->maximum && pPVar2->minimum <= progressValue)) &&
      (pQVar3->m_progressValue < progressValue)) &&
     (((pQVar3->state).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i & 0xcU) == 0)) {
    bVar1 = QFutureInterfaceBasePrivate::internal_updateProgress(pQVar3,progressValue,progressText);
    if (bVar1) {
      pQVar3 = this->d;
      QFutureCallOutEvent::QFutureCallOutEvent
                (&local_70,Progress,pQVar3->m_progressValue,&((pQVar3->m_progress).d)->text);
      QFutureInterfaceBasePrivate::sendCallOut(pQVar3,&local_70);
      QFutureCallOutEvent::~QFutureCallOutEvent(&local_70);
    }
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFutureInterfaceBase::setProgressValueAndText(int progressValue,
                                                   const QString &progressText)
{
    QMutexLocker locker(&d->m_mutex);
    if (!d->m_progress)
        d->m_progress.reset(new QFutureInterfaceBasePrivate::ProgressData());

    const bool useProgressRange = (d->m_progress->maximum != 0) || (d->m_progress->minimum != 0);
    if (useProgressRange
        && ((progressValue < d->m_progress->minimum) || (progressValue > d->m_progress->maximum))) {
        return;
    }

    if (d->m_progressValue >= progressValue)
        return;

    if (d->state.loadRelaxed() & (Canceled|Finished))
        return;

    if (d->internal_updateProgress(progressValue, progressText)) {
        d->sendCallOut(QFutureCallOutEvent(QFutureCallOutEvent::Progress,
                                           d->m_progressValue,
                                           d->m_progress->text));
    }
}